

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O1

int check_fixed_int(char *card,FILE *out)

{
  char *pcVar1;
  char cVar2;
  ushort **ppuVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = card + 10;
  while( true ) {
    cVar2 = *pcVar5;
    if (cVar2 != ' ') break;
    pcVar5 = pcVar5 + 1;
  }
  if ((cVar2 == '+') || (cVar2 == '-')) {
    pcVar5 = pcVar5 + 1;
  }
  ppuVar3 = __ctype_b_loc();
  pcVar4 = (char *)0x0;
  do {
    pcVar1 = pcVar5 + (long)pcVar4;
    pcVar4 = pcVar4 + 1;
  } while ((*(byte *)((long)*ppuVar3 + (long)*pcVar1 * 2 + 1) & 8) != 0);
  if (card + (0x1f - (long)pcVar5) != pcVar4) {
    sprintf(errmes,"%.8s mandatory keyword is not in integer fixed format:",card);
    wrterr(out,errmes,1);
    print_fmt(out,card,0xd);
    print_fmt(out,"          -------------------^",0xd);
  }
  return (uint)(card + (0x1f - (long)pcVar5) == pcVar4);
}

Assistant:

int check_fixed_int(char* card, FILE *out) 
{
    char *cptr;

    /* fixed format integer must be right justified in columns 11-30 */

    cptr = &card[10];

    while (*cptr == ' ')cptr++;  /* skip leading spaces */

    if (*cptr == '-')
        cptr++;  /* skip leading minus sign */
    else if (*cptr == '+')
        cptr++;  /* skip leading plus sign */

    while (isdigit((int) *cptr))cptr++;  /* skip digits */

    /* should be pointing to column 31 of the card */

    if ((cptr - card)  != 30) {
        sprintf(errmes,
            "%.8s mandatory keyword is not in integer fixed format:",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
        print_fmt(out,"          -------------------^",13);

        return 0;
    } 
    return 1; 
}